

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O1

hmm_context_t * hmm_context_init(int32 n_emit_state,int32 ***tp,int32 *senscore,s3senid_t **sseq)

{
  hmm_context_t *phVar1;
  int32 *piVar2;
  
  if (n_emit_state < 1) {
    __assert_fail("n_emit_state > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/hmm.c"
                  ,0x6f,"hmm_context_t *hmm_context_init(int32, int32 ***, int32 *, s3senid_t **)");
  }
  if (n_emit_state < 6) {
    phVar1 = (hmm_context_t *)
             __ckd_calloc__(1,0x30,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/hmm.c"
                            ,0x72);
    phVar1->n_emit_state = n_emit_state;
    phVar1->tp = tp;
    phVar1->senscore = senscore;
    phVar1->sseq = sseq;
    piVar2 = (int32 *)__ckd_calloc__((ulong)(uint)n_emit_state,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/hmm.c"
                                     ,0x77);
    phVar1->st_sen_scr = piVar2;
    return phVar1;
  }
  __assert_fail("n_emit_state <= MAX_HMM_NSTATE",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/hmm.c"
                ,0x70,"hmm_context_t *hmm_context_init(int32, int32 ***, int32 *, s3senid_t **)");
}

Assistant:

hmm_context_t *
hmm_context_init(int32 n_emit_state,
		 int32 ***tp,
		 int32 *senscore,
		 s3senid_t **sseq)
{
    hmm_context_t *ctx;

    assert(n_emit_state > 0);
    assert(n_emit_state <= MAX_HMM_NSTATE);

    ctx = ckd_calloc(1, sizeof(*ctx));
    ctx->n_emit_state = n_emit_state;
    ctx->tp = (const int32 ***)tp;
    ctx->senscore = senscore;
    ctx->sseq = (const s3senid_t **)sseq;
    ctx->st_sen_scr = ckd_calloc(n_emit_state, sizeof(*ctx->st_sen_scr));

    return ctx;
}